

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_valid(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  xmlChar *pxVar10;
  xmlChar *pxVar11;
  xmlChar *pxVar12;
  xmlChar *pxVar13;
  xmlAttributePtr pxVar14;
  xmlElementPtr pxVar15;
  xmlDocPtr pxVar16;
  xmlElementContentPtr pxVar17;
  xmlBufferPtr pxVar18;
  xmlDocPtr pxVar19;
  xmlAttrPtr pxVar20;
  xmlDocPtr pxVar21;
  xmlNodePtr val;
  xmlNsPtr pxVar22;
  size_t sVar23;
  ulong uVar24;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int nr;
  int nr_00;
  int nr_01;
  int nr_02;
  int nr_03;
  int nr_04;
  int nr_05;
  int nr_06;
  int nr_07;
  int nr_08;
  int nr_09;
  int nr_10;
  int nr_11;
  int nr_12;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int nr_13;
  int nr_14;
  int nr_15;
  int extraout_EDX_05;
  int nr_16;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int extraout_EDX_12;
  int extraout_EDX_13;
  int nr_17;
  int extraout_EDX_14;
  int extraout_EDX_15;
  int extraout_EDX_16;
  int extraout_EDX_17;
  int nr_18;
  int extraout_EDX_18;
  int extraout_EDX_19;
  int extraout_EDX_20;
  int extraout_EDX_21;
  int extraout_EDX_22;
  int extraout_EDX_23;
  int extraout_EDX_24;
  int extraout_EDX_25;
  int nr_19;
  int extraout_EDX_26;
  int extraout_EDX_27;
  int nr_20;
  int extraout_EDX_28;
  int extraout_EDX_29;
  int nr_21;
  int extraout_EDX_30;
  int extraout_EDX_31;
  int nr_22;
  int extraout_EDX_32;
  int extraout_EDX_33;
  int nr_23;
  int extraout_EDX_34;
  int extraout_EDX_35;
  ulong uVar25;
  bool bVar26;
  int n_doc;
  int iVar27;
  ulong uVar28;
  undefined4 uVar29;
  uint uVar30;
  xmlDocPtr in_RSI;
  int iVar31;
  undefined4 uVar32;
  int iVar33;
  undefined8 uVar34;
  int test_ret;
  int n_dtd;
  undefined1 auVar35 [12];
  int local_108;
  int local_104;
  int local_f8;
  int test_ret_6;
  int local_f0;
  int local_ec;
  int test_ret_7;
  int local_c4;
  int local_c0;
  int local_bc;
  int test_ret_5;
  int test_ret_1;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int test_ret_4;
  int test_ret_3;
  int test_ret_2;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  
  if (quiet == '\0') {
    puts("Testing valid : 50 of 70 functions ...");
  }
  local_f8 = 0;
  uVar28 = 0;
  while (iVar27 = (int)uVar28, iVar27 != 2) {
    for (uVar30 = 0; uVar30 != 3; uVar30 = uVar30 + 1) {
      for (iVar31 = 0; iVar31 != 5; iVar31 = iVar31 + 1) {
        for (iVar33 = 0; iVar33 != 5; iVar33 = iVar33 + 1) {
          for (uVar4 = 0; uVar4 != 5; uVar4 = uVar4 + 1) {
            uVar24 = 0;
            while (iVar6 = (int)uVar24, iVar6 != 4) {
              uVar25 = 0;
              while (iVar5 = (int)uVar25, iVar5 != 4) {
                for (iVar3 = 0; iVar3 != 5; iVar3 = iVar3 + 1) {
                  bVar26 = true;
                  while (iVar2 = (int)in_RSI, bVar26) {
                    iVar1 = xmlMemBlocks();
                    if (iVar27 == 0) {
                      lVar9 = xmlNewValidCtxt();
                    }
                    else {
                      lVar9 = 0;
                    }
                    in_RSI = (xmlDocPtr)gen_xmlDtdPtr(uVar30,iVar2);
                    pxVar10 = gen_const_xmlChar_ptr(iVar31,iVar2);
                    pxVar11 = gen_const_xmlChar_ptr(iVar33,iVar2);
                    pxVar12 = gen_const_xmlChar_ptr(uVar4,iVar2);
                    uVar29 = 0;
                    uVar32 = 0;
                    if (iVar6 - 1U < 3) {
                      uVar32 = *(undefined4 *)(&DAT_001510a4 + (ulong)(iVar6 - 1U) * 4);
                    }
                    if (iVar5 - 1U < 3) {
                      uVar29 = *(undefined4 *)(&DAT_0015108c + (ulong)(iVar5 - 1U) * 4);
                    }
                    pxVar13 = gen_const_xmlChar_ptr(iVar3,iVar2);
                    pxVar14 = (xmlAttributePtr)
                              xmlAddAttributeDecl(lVar9,in_RSI,pxVar10,pxVar11,pxVar12,uVar32,uVar29
                                                  ,pxVar13,0);
                    desret_xmlAttributePtr(pxVar14);
                    call_tests = call_tests + 1;
                    iVar2 = extraout_EDX;
                    if (lVar9 != 0) {
                      xmlFreeValidCtxt(lVar9);
                      iVar2 = extraout_EDX_00;
                    }
                    des_xmlDtdPtr(uVar30,(xmlDtdPtr)in_RSI,iVar2);
                    xmlResetLastError();
                    iVar2 = xmlMemBlocks();
                    if (iVar1 == iVar2) break;
                    iVar2 = xmlMemBlocks();
                    bVar26 = false;
                    printf("Leak of %d blocks found in xmlAddAttributeDecl",
                           (ulong)(uint)(iVar2 - iVar1));
                    local_f8 = local_f8 + 1;
                    printf(" %d",uVar28);
                    printf(" %d",(ulong)uVar30);
                    printf(" %d",iVar31);
                    printf(" %d",iVar33);
                    printf(" %d",(ulong)uVar4);
                    printf(" %d",uVar24);
                    printf(" %d",uVar25);
                    printf(" %d");
                    in_RSI = (xmlDocPtr)0x0;
                    printf(" %d");
                    putchar(10);
                  }
                }
                uVar25 = (ulong)(iVar5 + 1);
              }
              uVar24 = (ulong)(iVar6 + 1);
            }
          }
        }
      }
    }
    uVar28 = (ulong)(iVar27 + 1);
  }
  function_tests = function_tests + 1;
  local_108 = 0;
  for (uVar30 = 0; uVar30 != 2; uVar30 = uVar30 + 1) {
    uVar28 = 0;
    while (iVar27 = (int)uVar28, iVar27 != 3) {
      uVar24 = 0;
      while (iVar31 = (int)uVar24, iVar31 != 5) {
        for (iVar33 = 0; iVar33 != 4; iVar33 = iVar33 + 1) {
          bVar26 = true;
          while (iVar6 = (int)in_RSI, bVar26) {
            iVar5 = xmlMemBlocks();
            if (uVar30 == 0) {
              lVar9 = xmlNewValidCtxt();
            }
            else {
              lVar9 = 0;
            }
            in_RSI = (xmlDocPtr)gen_xmlDtdPtr(iVar27,iVar6);
            pxVar10 = gen_const_xmlChar_ptr(iVar31,iVar6);
            uVar32 = 0;
            if (iVar33 - 1U < 3) {
              uVar32 = *(undefined4 *)(&DAT_00151098 + (ulong)(iVar33 - 1U) * 4);
            }
            pxVar15 = (xmlElementPtr)xmlAddElementDecl(lVar9,in_RSI,pxVar10,uVar32,0);
            desret_xmlElementPtr(pxVar15);
            call_tests = call_tests + 1;
            iVar6 = extraout_EDX_01;
            if (lVar9 != 0) {
              xmlFreeValidCtxt(lVar9);
              iVar6 = extraout_EDX_02;
            }
            des_xmlDtdPtr(iVar27,(xmlDtdPtr)in_RSI,iVar6);
            xmlResetLastError();
            iVar6 = xmlMemBlocks();
            if (iVar5 == iVar6) break;
            iVar6 = xmlMemBlocks();
            bVar26 = false;
            printf("Leak of %d blocks found in xmlAddElementDecl",(ulong)(uint)(iVar6 - iVar5));
            local_108 = local_108 + 1;
            printf(" %d",(ulong)uVar30);
            printf(" %d",uVar28);
            printf(" %d",uVar24);
            printf(" %d");
            in_RSI = (xmlDocPtr)0x0;
            printf(" %d");
            putchar(10);
          }
        }
        uVar24 = (ulong)(iVar31 + 1);
      }
      uVar28 = (ulong)(iVar27 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar31 = 0;
  for (iVar27 = 0; iVar27 != 4; iVar27 = iVar27 + 1) {
    bVar26 = true;
    while (iVar33 = (int)in_RSI, bVar26) {
      iVar6 = xmlMemBlocks();
      pxVar16 = gen_xmlDocPtr(iVar27,iVar33);
      in_RSI = (xmlDocPtr)0x0;
      pxVar17 = (xmlElementContentPtr)xmlCopyDocElementContent(pxVar16);
      desret_xmlElementContentPtr(pxVar17);
      call_tests = call_tests + 1;
      des_xmlDocPtr((int)pxVar16,in_RSI,nr);
      xmlResetLastError();
      iVar33 = xmlMemBlocks();
      if (iVar6 == iVar33) break;
      iVar33 = xmlMemBlocks();
      bVar26 = false;
      printf("Leak of %d blocks found in xmlCopyDocElementContent",(ulong)(uint)(iVar33 - iVar6));
      iVar31 = iVar31 + 1;
      printf(" %d");
      in_RSI = (xmlDocPtr)0x0;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_f8 = -(local_f8 + local_108 + iVar31);
  bVar26 = true;
  while (bVar26) {
    iVar27 = xmlMemBlocks();
    pxVar17 = (xmlElementContentPtr)xmlCopyElementContent(0);
    desret_xmlElementContentPtr(pxVar17);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar31 = xmlMemBlocks();
    if (iVar27 == iVar31) break;
    xmlMemBlocks();
    bVar26 = false;
    printf("Leak of %d blocks found in xmlCopyElementContent");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_f8 = local_f8 + -1;
  }
  function_tests = function_tests + 1;
  iVar27 = 0;
  local_a0 = 0;
  do {
    if (iVar27 == 3) {
      function_tests = function_tests + 1;
      iVar27 = 0;
      local_a4 = 0;
      do {
        if (iVar27 == 3) {
          function_tests = function_tests + 1;
          iVar27 = 0;
          local_a8 = 0;
          do {
            if (iVar27 == 3) {
              function_tests = function_tests + 1;
              iVar27 = 0;
              local_ac = 0;
              do {
                if (iVar27 == 3) {
                  function_tests = function_tests + 1;
                  iVar27 = 0;
                  local_b0 = 0;
                  do {
                    if (iVar27 == 3) {
                      function_tests = function_tests + 1;
                      iVar27 = 0;
                      test_ret_1 = 0;
                      do {
                        if (iVar27 == 3) {
                          function_tests = function_tests + 1;
                          local_44 = 0;
                          for (uVar30 = 0; uVar30 != 3; uVar30 = uVar30 + 1) {
                            uVar28 = 0;
                            while (iVar27 = (int)uVar28, iVar27 != 5) {
                              pxVar16 = (xmlDocPtr)0x0;
                              while( true ) {
                                iVar31 = (int)in_RSI;
                                iVar33 = (int)pxVar16;
                                if (iVar33 == 5) break;
                                iVar6 = xmlMemBlocks();
                                in_RSI = (xmlDocPtr)gen_xmlDtdPtr(uVar30,iVar31);
                                pxVar10 = gen_const_xmlChar_ptr(iVar27,iVar31);
                                pxVar11 = gen_const_xmlChar_ptr(iVar33,iVar31);
                                pxVar14 = (xmlAttributePtr)xmlGetDtdAttrDesc(in_RSI,pxVar10,pxVar11)
                                ;
                                desret_xmlAttributePtr(pxVar14);
                                call_tests = call_tests + 1;
                                des_xmlDtdPtr(uVar30,(xmlDtdPtr)in_RSI,nr_00);
                                xmlResetLastError();
                                iVar31 = xmlMemBlocks();
                                if (iVar6 != iVar31) {
                                  iVar31 = xmlMemBlocks();
                                  printf("Leak of %d blocks found in xmlGetDtdAttrDesc",
                                         (ulong)(uint)(iVar31 - iVar6));
                                  local_44 = local_44 + 1;
                                  printf(" %d",(ulong)uVar30);
                                  printf(" %d",uVar28);
                                  printf(" %d");
                                  putchar(10);
                                  in_RSI = pxVar16;
                                }
                                pxVar16 = (xmlDocPtr)(ulong)(iVar33 + 1);
                              }
                              uVar28 = (ulong)(iVar27 + 1);
                            }
                          }
                          function_tests = function_tests + 1;
                          test_ret_2 = 0;
                          for (uVar30 = 0; uVar30 != 3; uVar30 = uVar30 + 1) {
                            pxVar16 = (xmlDocPtr)0x0;
                            while( true ) {
                              iVar27 = (int)in_RSI;
                              iVar31 = (int)pxVar16;
                              if (iVar31 == 5) break;
                              iVar33 = xmlMemBlocks();
                              in_RSI = (xmlDocPtr)gen_xmlDtdPtr(uVar30,iVar27);
                              pxVar10 = gen_const_xmlChar_ptr(iVar31,iVar27);
                              pxVar15 = (xmlElementPtr)xmlGetDtdElementDesc(in_RSI,pxVar10);
                              desret_xmlElementPtr(pxVar15);
                              call_tests = call_tests + 1;
                              des_xmlDtdPtr(uVar30,(xmlDtdPtr)in_RSI,nr_01);
                              xmlResetLastError();
                              iVar27 = xmlMemBlocks();
                              if (iVar33 != iVar27) {
                                iVar27 = xmlMemBlocks();
                                printf("Leak of %d blocks found in xmlGetDtdElementDesc",
                                       (ulong)(uint)(iVar27 - iVar33));
                                test_ret_2 = test_ret_2 + 1;
                                printf(" %d",(ulong)uVar30);
                                printf(" %d");
                                putchar(10);
                                in_RSI = pxVar16;
                              }
                              pxVar16 = (xmlDocPtr)(ulong)(iVar31 + 1);
                            }
                          }
                          function_tests = function_tests + 1;
                          iVar27 = 0;
                          uVar28 = 0;
                          while (iVar31 = (int)uVar28, iVar31 != 3) {
                            for (iVar33 = 0; iVar33 != 5; iVar33 = iVar33 + 1) {
                              for (uVar30 = 0; uVar30 != 5; uVar30 = uVar30 + 1) {
                                pxVar16 = (xmlDocPtr)0x0;
                                while( true ) {
                                  iVar5 = (int)in_RSI;
                                  iVar6 = (int)pxVar16;
                                  if (iVar6 == 5) break;
                                  iVar3 = xmlMemBlocks();
                                  in_RSI = (xmlDocPtr)gen_xmlDtdPtr(iVar31,iVar5);
                                  pxVar10 = gen_const_xmlChar_ptr(iVar33,iVar5);
                                  pxVar11 = gen_const_xmlChar_ptr(uVar30,iVar5);
                                  pxVar12 = gen_const_xmlChar_ptr(iVar6,iVar5);
                                  pxVar14 = (xmlAttributePtr)
                                            xmlGetDtdQAttrDesc(in_RSI,pxVar10,pxVar11,pxVar12);
                                  desret_xmlAttributePtr(pxVar14);
                                  call_tests = call_tests + 1;
                                  des_xmlDtdPtr(iVar31,(xmlDtdPtr)in_RSI,nr_02);
                                  xmlResetLastError();
                                  iVar5 = xmlMemBlocks();
                                  if (iVar3 != iVar5) {
                                    iVar5 = xmlMemBlocks();
                                    printf("Leak of %d blocks found in xmlGetDtdQAttrDesc",
                                           (ulong)(uint)(iVar5 - iVar3));
                                    iVar27 = iVar27 + 1;
                                    printf(" %d",uVar28);
                                    printf(" %d",iVar33);
                                    printf(" %d",(ulong)uVar30);
                                    printf(" %d");
                                    putchar(10);
                                    in_RSI = pxVar16;
                                  }
                                  pxVar16 = (xmlDocPtr)(ulong)(iVar6 + 1);
                                }
                              }
                            }
                            uVar28 = (ulong)(iVar31 + 1);
                          }
                          function_tests = function_tests + 1;
                          local_48 = 0;
                          for (uVar30 = 0; uVar30 != 3; uVar30 = uVar30 + 1) {
                            uVar28 = 0;
                            while (iVar31 = (int)uVar28, iVar31 != 5) {
                              pxVar16 = (xmlDocPtr)0x0;
                              while( true ) {
                                iVar33 = (int)in_RSI;
                                iVar6 = (int)pxVar16;
                                if (iVar6 == 5) break;
                                iVar5 = xmlMemBlocks();
                                in_RSI = (xmlDocPtr)gen_xmlDtdPtr(uVar30,iVar33);
                                pxVar10 = gen_const_xmlChar_ptr(iVar31,iVar33);
                                pxVar11 = gen_const_xmlChar_ptr(iVar6,iVar33);
                                pxVar15 = (xmlElementPtr)
                                          xmlGetDtdQElementDesc(in_RSI,pxVar10,pxVar11);
                                desret_xmlElementPtr(pxVar15);
                                call_tests = call_tests + 1;
                                des_xmlDtdPtr(uVar30,(xmlDtdPtr)in_RSI,nr_03);
                                xmlResetLastError();
                                iVar33 = xmlMemBlocks();
                                if (iVar5 != iVar33) {
                                  iVar33 = xmlMemBlocks();
                                  printf("Leak of %d blocks found in xmlGetDtdQElementDesc",
                                         (ulong)(uint)(iVar33 - iVar5));
                                  local_48 = local_48 + 1;
                                  printf(" %d",(ulong)uVar30);
                                  printf(" %d",uVar28);
                                  printf(" %d");
                                  putchar(10);
                                  in_RSI = pxVar16;
                                }
                                pxVar16 = (xmlDocPtr)(ulong)(iVar6 + 1);
                              }
                              uVar28 = (ulong)(iVar31 + 1);
                            }
                          }
                          function_tests = function_tests + 1;
                          test_ret_3 = 0;
                          for (uVar30 = 0; uVar30 != 4; uVar30 = uVar30 + 1) {
                            pxVar16 = (xmlDocPtr)0x0;
                            while( true ) {
                              iVar31 = (int)in_RSI;
                              iVar33 = (int)pxVar16;
                              if (iVar33 == 5) break;
                              iVar6 = xmlMemBlocks();
                              pxVar19 = gen_xmlDocPtr(uVar30,iVar31);
                              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar33,iVar31);
                              pxVar20 = (xmlAttrPtr)xmlGetID(pxVar19);
                              desret_xmlAttrPtr(pxVar20);
                              call_tests = call_tests + 1;
                              des_xmlDocPtr((int)pxVar19,in_RSI,nr_04);
                              xmlResetLastError();
                              iVar31 = xmlMemBlocks();
                              if (iVar6 != iVar31) {
                                iVar31 = xmlMemBlocks();
                                printf("Leak of %d blocks found in xmlGetID",
                                       (ulong)(uint)(iVar31 - iVar6));
                                test_ret_3 = test_ret_3 + 1;
                                printf(" %d",(ulong)uVar30);
                                printf(" %d");
                                putchar(10);
                                in_RSI = pxVar16;
                              }
                              pxVar16 = (xmlDocPtr)(ulong)(iVar33 + 1);
                            }
                          }
                          function_tests = function_tests + 1;
                          local_4c = 0;
                          for (uVar30 = 0; uVar30 != 4; uVar30 = uVar30 + 1) {
                            uVar28 = 0;
                            while (iVar31 = (int)uVar28, iVar31 != 3) {
                              pxVar16 = (xmlDocPtr)0x0;
                              while( true ) {
                                iVar33 = (int)in_RSI;
                                iVar6 = (int)pxVar16;
                                if (iVar6 == 2) break;
                                iVar5 = xmlMemBlocks();
                                pxVar21 = gen_xmlDocPtr(uVar30,iVar33);
                                in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar31,iVar33);
                                pxVar20 = gen_xmlAttrPtr(iVar6,iVar33);
                                pxVar19 = in_RSI;
                                xmlIsID(pxVar21,in_RSI,pxVar20);
                                call_tests = call_tests + 1;
                                des_xmlDocPtr((int)pxVar21,pxVar19,nr_05);
                                des_xmlNodePtr(iVar31,(xmlNodePtr)in_RSI,nr_06);
                                if (iVar6 == 0) {
                                  free_api_doc();
                                }
                                xmlResetLastError();
                                iVar33 = xmlMemBlocks();
                                if (iVar5 != iVar33) {
                                  iVar33 = xmlMemBlocks();
                                  printf("Leak of %d blocks found in xmlIsID",
                                         (ulong)(uint)(iVar33 - iVar5));
                                  local_4c = local_4c + 1;
                                  printf(" %d",(ulong)uVar30);
                                  printf(" %d",uVar28);
                                  printf(" %d");
                                  putchar(10);
                                  in_RSI = pxVar16;
                                }
                                pxVar16 = (xmlDocPtr)(ulong)(iVar6 + 1);
                              }
                              uVar28 = (ulong)(iVar31 + 1);
                            }
                          }
                          function_tests = function_tests + 1;
                          test_ret_4 = 0;
                          for (uVar30 = 0; uVar30 != 4; uVar30 = uVar30 + 1) {
                            pxVar16 = (xmlDocPtr)0x0;
                            while( true ) {
                              iVar31 = (int)in_RSI;
                              iVar33 = (int)pxVar16;
                              if (iVar33 == 5) break;
                              iVar6 = xmlMemBlocks();
                              pxVar19 = gen_xmlDocPtr(uVar30,iVar31);
                              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar33,iVar31);
                              xmlIsMixedElement(pxVar19);
                              call_tests = call_tests + 1;
                              des_xmlDocPtr((int)pxVar19,in_RSI,nr_07);
                              xmlResetLastError();
                              iVar31 = xmlMemBlocks();
                              if (iVar6 != iVar31) {
                                iVar31 = xmlMemBlocks();
                                printf("Leak of %d blocks found in xmlIsMixedElement",
                                       (ulong)(uint)(iVar31 - iVar6));
                                test_ret_4 = test_ret_4 + 1;
                                printf(" %d",(ulong)uVar30);
                                printf(" %d");
                                putchar(10);
                                in_RSI = pxVar16;
                              }
                              pxVar16 = (xmlDocPtr)(ulong)(iVar33 + 1);
                            }
                          }
                          function_tests = function_tests + 1;
                          local_50 = 0;
                          for (uVar30 = 0; uVar30 != 4; uVar30 = uVar30 + 1) {
                            uVar28 = 0;
                            while (iVar31 = (int)uVar28, iVar31 != 3) {
                              pxVar16 = (xmlDocPtr)0x0;
                              while( true ) {
                                iVar33 = (int)in_RSI;
                                iVar6 = (int)pxVar16;
                                if (iVar6 == 2) break;
                                iVar5 = xmlMemBlocks();
                                pxVar21 = gen_xmlDocPtr(uVar30,iVar33);
                                in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar31,iVar33);
                                pxVar20 = gen_xmlAttrPtr(iVar6,iVar33);
                                pxVar19 = in_RSI;
                                xmlIsRef(pxVar21,in_RSI,pxVar20);
                                call_tests = call_tests + 1;
                                des_xmlDocPtr((int)pxVar21,pxVar19,nr_08);
                                des_xmlNodePtr(iVar31,(xmlNodePtr)in_RSI,nr_09);
                                if (iVar6 == 0) {
                                  free_api_doc();
                                }
                                xmlResetLastError();
                                iVar33 = xmlMemBlocks();
                                if (iVar5 != iVar33) {
                                  iVar33 = xmlMemBlocks();
                                  printf("Leak of %d blocks found in xmlIsRef",
                                         (ulong)(uint)(iVar33 - iVar5));
                                  local_50 = local_50 + 1;
                                  printf(" %d",(ulong)uVar30);
                                  printf(" %d",uVar28);
                                  printf(" %d");
                                  putchar(10);
                                  in_RSI = pxVar16;
                                }
                                pxVar16 = (xmlDocPtr)(ulong)(iVar6 + 1);
                              }
                              uVar28 = (ulong)(iVar31 + 1);
                            }
                          }
                          function_tests = function_tests + 1;
                          local_54 = 0;
                          for (uVar30 = 0; uVar30 != 4; uVar30 = uVar30 + 1) {
                            uVar28 = 0;
                            while (iVar31 = (int)uVar28, iVar31 != 5) {
                              pxVar16 = (xmlDocPtr)0xffffffffffffffff;
                              while( true ) {
                                iVar33 = (int)in_RSI;
                                uVar4 = (uint)pxVar16;
                                if (uVar4 == 3) break;
                                iVar6 = xmlMemBlocks();
                                pxVar19 = gen_xmlDocPtr(uVar30,iVar33);
                                pxVar10 = gen_const_xmlChar_ptr(iVar31,iVar33);
                                uVar32 = 0;
                                if (uVar4 < 3) {
                                  uVar32 = *(undefined4 *)
                                            (&DAT_00151098 + ((ulong)pxVar16 & 0xffffffff) * 4);
                                }
                                pxVar16 = (xmlDocPtr)(ulong)(uVar4 + 1);
                                in_RSI = (xmlDocPtr)xmlNewDocElementContent(pxVar19,pxVar10,uVar32);
                                xmlFreeDocElementContent(pxVar19);
                                call_tests = call_tests + 1;
                                des_xmlDocPtr((int)pxVar19,in_RSI,nr_10);
                                xmlResetLastError();
                                iVar33 = xmlMemBlocks();
                                if (iVar6 != iVar33) {
                                  iVar33 = xmlMemBlocks();
                                  printf("Leak of %d blocks found in xmlNewDocElementContent",
                                         (ulong)(uint)(iVar33 - iVar6));
                                  local_54 = local_54 + 1;
                                  printf(" %d",(ulong)uVar30);
                                  printf(" %d",uVar28);
                                  in_RSI = pxVar16;
                                  printf(" %d");
                                  putchar(10);
                                }
                              }
                              uVar28 = (ulong)(iVar31 + 1);
                            }
                          }
                          function_tests = function_tests + 1;
                          local_84 = 0;
                          for (uVar30 = 0; uVar30 != 5; uVar30 = uVar30 + 1) {
                            pxVar16 = (xmlDocPtr)0xffffffffffffffff;
                            while( true ) {
                              iVar31 = (int)in_RSI;
                              uVar4 = (uint)pxVar16;
                              if (uVar4 == 3) break;
                              iVar33 = xmlMemBlocks();
                              pxVar10 = gen_const_xmlChar_ptr(uVar30,iVar31);
                              in_RSI = (xmlDocPtr)0x0;
                              if (uVar4 < 3) {
                                in_RSI = (xmlDocPtr)
                                         (ulong)*(uint *)(&DAT_00151098 +
                                                         ((ulong)pxVar16 & 0xffffffff) * 4);
                              }
                              pxVar16 = (xmlDocPtr)(ulong)(uVar4 + 1);
                              pxVar17 = (xmlElementContentPtr)xmlNewElementContent(pxVar10);
                              desret_xmlElementContentPtr(pxVar17);
                              call_tests = call_tests + 1;
                              xmlResetLastError();
                              iVar31 = xmlMemBlocks();
                              if (iVar33 != iVar31) {
                                iVar31 = xmlMemBlocks();
                                printf("Leak of %d blocks found in xmlNewElementContent",
                                       (ulong)(uint)(iVar31 - iVar33));
                                local_84 = local_84 + 1;
                                printf(" %d",(ulong)uVar30);
                                in_RSI = pxVar16;
                                printf(" %d");
                                putchar(10);
                              }
                            }
                          }
                          function_tests = function_tests + 1;
                          local_88 = 0;
                          for (uVar30 = 0; uVar30 != 4; uVar30 = uVar30 + 1) {
                            pxVar16 = (xmlDocPtr)0x0;
                            while( true ) {
                              iVar31 = (int)in_RSI;
                              iVar33 = (int)pxVar16;
                              if (iVar33 == 2) break;
                              iVar6 = xmlMemBlocks();
                              pxVar19 = gen_xmlDocPtr(uVar30,iVar31);
                              in_RSI = (xmlDocPtr)gen_xmlAttrPtr(iVar33,iVar31);
                              xmlRemoveID(pxVar19);
                              call_tests = call_tests + 1;
                              des_xmlDocPtr((int)pxVar19,in_RSI,nr_11);
                              if (iVar33 == 0) {
                                free_api_doc();
                              }
                              xmlResetLastError();
                              iVar31 = xmlMemBlocks();
                              if (iVar6 != iVar31) {
                                iVar31 = xmlMemBlocks();
                                printf("Leak of %d blocks found in xmlRemoveID",
                                       (ulong)(uint)(iVar31 - iVar6));
                                local_88 = local_88 + 1;
                                printf(" %d",(ulong)uVar30);
                                printf(" %d");
                                putchar(10);
                                in_RSI = pxVar16;
                              }
                              pxVar16 = (xmlDocPtr)(ulong)(iVar33 + 1);
                            }
                          }
                          function_tests = function_tests + 1;
                          local_8c = 0;
                          uVar28 = 0;
                          while (iVar31 = (int)uVar28, iVar31 != 4) {
                            pxVar16 = (xmlDocPtr)0x0;
                            while( true ) {
                              iVar33 = (int)in_RSI;
                              iVar6 = (int)pxVar16;
                              if (iVar6 == 2) break;
                              iVar5 = xmlMemBlocks();
                              pxVar19 = gen_xmlDocPtr(iVar31,iVar33);
                              in_RSI = (xmlDocPtr)gen_xmlAttrPtr(iVar6,iVar33);
                              xmlRemoveRef(pxVar19);
                              call_tests = call_tests + 1;
                              des_xmlDocPtr((int)pxVar19,in_RSI,nr_12);
                              if (iVar6 == 0) {
                                free_api_doc();
                              }
                              xmlResetLastError();
                              iVar33 = xmlMemBlocks();
                              if (iVar5 != iVar33) {
                                iVar33 = xmlMemBlocks();
                                printf("Leak of %d blocks found in xmlRemoveRef",
                                       (ulong)(uint)(iVar33 - iVar5));
                                local_8c = local_8c + 1;
                                printf(" %d",uVar28);
                                printf(" %d");
                                putchar(10);
                                in_RSI = pxVar16;
                              }
                              pxVar16 = (xmlDocPtr)(ulong)(iVar6 + 1);
                            }
                            uVar28 = (ulong)(iVar31 + 1);
                          }
                          function_tests = function_tests + 1;
                          bVar26 = true;
                          local_f0 = 0;
                          while (bVar26) {
                            uVar28 = 0;
                            while (iVar31 = (int)uVar28, iVar31 != 4) {
                              bVar26 = true;
                              while (bVar26) {
                                pxVar16 = (xmlDocPtr)0x0;
                                while( true ) {
                                  iVar33 = (int)in_RSI;
                                  iVar6 = (int)pxVar16;
                                  if (iVar6 == 4) break;
                                  iVar5 = xmlMemBlocks();
                                  uVar30 = gen_int(iVar31,iVar33);
                                  iVar33 = gen_int(iVar6,iVar33);
                                  in_RSI = (xmlDocPtr)(ulong)uVar30;
                                  xmlSnprintfElementContent(0,in_RSI,0,iVar33);
                                  call_tests = call_tests + 1;
                                  xmlResetLastError();
                                  iVar33 = xmlMemBlocks();
                                  if (iVar5 != iVar33) {
                                    iVar33 = xmlMemBlocks();
                                    printf("Leak of %d blocks found in xmlSnprintfElementContent",
                                           (ulong)(uint)(iVar33 - iVar5));
                                    local_f0 = local_f0 + 1;
                                    printf(" %d",0);
                                    printf(" %d",uVar28);
                                    printf(" %d",0);
                                    printf(" %d");
                                    putchar(10);
                                    in_RSI = pxVar16;
                                  }
                                  pxVar16 = (xmlDocPtr)(ulong)(iVar6 + 1);
                                }
                                bVar26 = false;
                              }
                              uVar28 = (ulong)(iVar31 + 1);
                            }
                            bVar26 = false;
                          }
                          function_tests = function_tests + 1;
                          pxVar16 = (xmlDocPtr)0x1;
                          local_58 = 0;
                          while (pxVar16 != (xmlDocPtr)0x0) {
                            bVar26 = true;
                            while (pxVar16 = (xmlDocPtr)0x0, bVar26) {
                              while( true ) {
                                iVar31 = (int)in_RSI;
                                iVar33 = (int)pxVar16;
                                if (iVar33 == 4) break;
                                iVar6 = xmlMemBlocks();
                                iVar31 = gen_int(iVar33,iVar31);
                                in_RSI = (xmlDocPtr)0x0;
                                xmlSprintfElementContent(0,0,iVar31);
                                call_tests = call_tests + 1;
                                xmlResetLastError();
                                iVar31 = xmlMemBlocks();
                                if (iVar6 != iVar31) {
                                  iVar31 = xmlMemBlocks();
                                  printf("Leak of %d blocks found in xmlSprintfElementContent",
                                         (ulong)(uint)(iVar31 - iVar6));
                                  local_58 = local_58 + 1;
                                  printf(" %d",0);
                                  printf(" %d",0);
                                  printf(" %d");
                                  putchar(10);
                                  in_RSI = pxVar16;
                                }
                                pxVar16 = (xmlDocPtr)(ulong)(iVar33 + 1);
                              }
                              bVar26 = false;
                            }
                          }
                          function_tests = function_tests + 1;
                          iVar31 = 0;
                          test_ret_5 = 0;
                          do {
                            if (iVar31 == 2) {
                              function_tests = function_tests + 1;
                              iVar31 = 0;
                              for (uVar30 = 0; uVar30 != 2; uVar30 = uVar30 + 1) {
                                for (uVar4 = 0; uVar4 != 4; uVar4 = uVar4 + 1) {
                                  uVar28 = 0;
                                  while (iVar33 = (int)uVar28, iVar33 != 3) {
                                    for (iVar6 = 0; iVar6 != 5; iVar6 = iVar6 + 1) {
                                      pxVar16 = (xmlDocPtr)0x0;
                                      while( true ) {
                                        iVar3 = (int)in_RSI;
                                        iVar5 = (int)pxVar16;
                                        if (iVar5 == 5) break;
                                        iVar2 = xmlMemBlocks();
                                        if (uVar30 == 0) {
                                          lVar9 = xmlNewValidCtxt();
                                        }
                                        else {
                                          lVar9 = 0;
                                        }
                                        pxVar21 = gen_xmlDocPtr(uVar4,iVar3);
                                        in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar33,iVar3);
                                        pxVar10 = gen_const_xmlChar_ptr(iVar6,iVar3);
                                        pxVar11 = gen_const_xmlChar_ptr(iVar5,iVar3);
                                        pxVar19 = pxVar21;
                                        auVar35 = xmlValidCtxtNormalizeAttributeValue
                                                            (lVar9,pxVar21,in_RSI,pxVar10,pxVar11);
                                        iVar3 = auVar35._8_4_;
                                        if (auVar35._0_8_ != 0) {
                                          (*_xmlFree)(auVar35._0_8_);
                                          iVar3 = extraout_EDX_03;
                                        }
                                        call_tests = call_tests + 1;
                                        if (lVar9 != 0) {
                                          xmlFreeValidCtxt(lVar9);
                                          iVar3 = extraout_EDX_04;
                                        }
                                        des_xmlDocPtr((int)pxVar21,pxVar19,iVar3);
                                        des_xmlNodePtr(iVar33,(xmlNodePtr)in_RSI,nr_13);
                                        xmlResetLastError();
                                        iVar3 = xmlMemBlocks();
                                        if (iVar2 != iVar3) {
                                          iVar3 = xmlMemBlocks();
                                          printf("Leak of %d blocks found in xmlValidCtxtNormalizeAttributeValue"
                                                 ,(ulong)(uint)(iVar3 - iVar2));
                                          iVar31 = iVar31 + 1;
                                          printf(" %d",(ulong)uVar30);
                                          printf(" %d",(ulong)uVar4);
                                          printf(" %d",uVar28);
                                          printf(" %d",iVar6);
                                          printf(" %d");
                                          putchar(10);
                                          in_RSI = pxVar16;
                                        }
                                        pxVar16 = (xmlDocPtr)(ulong)(iVar5 + 1);
                                      }
                                    }
                                    uVar28 = (ulong)(iVar33 + 1);
                                  }
                                }
                              }
                              function_tests = function_tests + 1;
                              uVar28 = 1;
                              test_ret_6 = 0;
                              while (uVar28 != 0) {
                                pxVar16 = (xmlDocPtr)0x1;
                                while (uVar28 = 0, pxVar16 != (xmlDocPtr)0x0) {
                                  while( true ) {
                                    pxVar16 = (xmlDocPtr)0x0;
                                    iVar33 = (int)uVar28;
                                    if (iVar33 == 2) break;
                                    uVar34 = 0;
                                    if (iVar33 == 0) {
                                      uVar34 = 0x1668d8;
                                    }
                                    while( true ) {
                                      iVar6 = (int)in_RSI;
                                      iVar5 = (int)pxVar16;
                                      if (iVar5 == 4) break;
                                      iVar3 = xmlMemBlocks();
                                      iVar6 = gen_int(iVar5,iVar6);
                                      in_RSI = (xmlDocPtr)0x0;
                                      xmlValidGetPotentialChildren(0,0,uVar34,iVar6);
                                      call_tests = call_tests + 1;
                                      xmlResetLastError();
                                      iVar6 = xmlMemBlocks();
                                      if (iVar3 != iVar6) {
                                        iVar6 = xmlMemBlocks();
                                        printf("Leak of %d blocks found in xmlValidGetPotentialChildren"
                                               ,(ulong)(uint)(iVar6 - iVar3));
                                        test_ret_6 = test_ret_6 + 1;
                                        printf(" %d",0);
                                        printf(" %d",0);
                                        printf(" %d",uVar28);
                                        printf(" %d");
                                        putchar(10);
                                        in_RSI = pxVar16;
                                      }
                                      pxVar16 = (xmlDocPtr)(ulong)(iVar5 + 1);
                                    }
                                    uVar28 = (ulong)(iVar33 + 1);
                                  }
                                }
                              }
                              function_tests = function_tests + 1;
                              local_3c = 0;
                              for (uVar30 = 0; uVar30 != 3; uVar30 = uVar30 + 1) {
                                uVar28 = 0;
                                while (iVar33 = (int)uVar28, iVar33 != 3) {
                                  bVar26 = true;
                                  while (bVar26) {
                                    pxVar16 = (xmlDocPtr)0x0;
                                    while( true ) {
                                      iVar6 = (int)in_RSI;
                                      iVar5 = (int)pxVar16;
                                      if (iVar5 == 4) break;
                                      iVar3 = xmlMemBlocks();
                                      val = gen_xmlNodePtr(uVar30,iVar6);
                                      in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar33,iVar6);
                                      iVar6 = gen_int(iVar5,iVar6);
                                      xmlValidGetValidElements(val,in_RSI,0,iVar6);
                                      call_tests = call_tests + 1;
                                      des_xmlNodePtr(uVar30,val,nr_14);
                                      des_xmlNodePtr(iVar33,(xmlNodePtr)in_RSI,nr_15);
                                      xmlResetLastError();
                                      iVar6 = xmlMemBlocks();
                                      if (iVar3 != iVar6) {
                                        iVar6 = xmlMemBlocks();
                                        printf("Leak of %d blocks found in xmlValidGetValidElements"
                                               ,(ulong)(uint)(iVar6 - iVar3));
                                        local_3c = local_3c + 1;
                                        printf(" %d",(ulong)uVar30);
                                        printf(" %d",uVar28);
                                        printf(" %d",0);
                                        printf(" %d");
                                        putchar(10);
                                        in_RSI = pxVar16;
                                      }
                                      pxVar16 = (xmlDocPtr)(ulong)(iVar5 + 1);
                                    }
                                    bVar26 = false;
                                  }
                                  uVar28 = (ulong)(iVar33 + 1);
                                }
                              }
                              function_tests = function_tests + 1;
                              local_40 = 0;
                              for (iVar33 = 0; iVar33 != 4; iVar33 = iVar33 + 1) {
                                uVar28 = 0;
                                while (iVar6 = (int)uVar28, iVar6 != 3) {
                                  for (iVar5 = 0; iVar5 != 5; iVar5 = iVar5 + 1) {
                                    pxVar16 = (xmlDocPtr)0x0;
                                    while( true ) {
                                      iVar2 = (int)in_RSI;
                                      iVar3 = (int)pxVar16;
                                      if (iVar3 == 5) break;
                                      iVar1 = xmlMemBlocks();
                                      pxVar21 = gen_xmlDocPtr(iVar33,iVar2);
                                      in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar6,iVar2);
                                      pxVar10 = gen_const_xmlChar_ptr(iVar5,iVar2);
                                      pxVar11 = gen_const_xmlChar_ptr(iVar3,iVar2);
                                      pxVar19 = in_RSI;
                                      auVar35 = xmlValidNormalizeAttributeValue
                                                          (pxVar21,in_RSI,pxVar10,pxVar11);
                                      iVar2 = auVar35._8_4_;
                                      if (auVar35._0_8_ != 0) {
                                        (*_xmlFree)(auVar35._0_8_);
                                        iVar2 = extraout_EDX_05;
                                      }
                                      call_tests = call_tests + 1;
                                      des_xmlDocPtr((int)pxVar21,pxVar19,iVar2);
                                      des_xmlNodePtr(iVar6,(xmlNodePtr)in_RSI,nr_16);
                                      xmlResetLastError();
                                      iVar2 = xmlMemBlocks();
                                      if (iVar1 != iVar2) {
                                        iVar2 = xmlMemBlocks();
                                        printf("Leak of %d blocks found in xmlValidNormalizeAttributeValue"
                                               ,(ulong)(uint)(iVar2 - iVar1));
                                        local_40 = local_40 + 1;
                                        printf(" %d",iVar33);
                                        printf(" %d",uVar28);
                                        printf(" %d",iVar5);
                                        printf(" %d");
                                        putchar(10);
                                        in_RSI = pxVar16;
                                      }
                                      pxVar16 = (xmlDocPtr)(ulong)(iVar3 + 1);
                                    }
                                  }
                                  uVar28 = (ulong)(iVar6 + 1);
                                }
                              }
                              function_tests = function_tests + 1;
                              uVar28 = 0;
                              local_6c = 0;
                              do {
                                iVar33 = (int)uVar28;
                                if (iVar33 == 2) {
                                  function_tests = function_tests + 1;
                                  local_90 = 0;
                                  for (uVar30 = 0; uVar30 != 4; uVar30 = uVar30 + 1) {
                                    pxVar16 = (xmlDocPtr)0x0;
                                    while( true ) {
                                      iVar33 = (int)in_RSI;
                                      iVar6 = (int)pxVar16;
                                      if (iVar6 == 5) break;
                                      iVar5 = xmlMemBlocks();
                                      uVar32 = 0;
                                      if (uVar30 - 1 < 3) {
                                        uVar32 = *(undefined4 *)
                                                  (&DAT_001510a4 + (ulong)(uVar30 - 1) * 4);
                                      }
                                      in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar6,iVar33);
                                      xmlValidateAttributeValue(uVar32);
                                      call_tests = call_tests + 1;
                                      xmlResetLastError();
                                      iVar33 = xmlMemBlocks();
                                      if (iVar5 != iVar33) {
                                        iVar33 = xmlMemBlocks();
                                        printf("Leak of %d blocks found in xmlValidateAttributeValue"
                                               ,(ulong)(uint)(iVar33 - iVar5));
                                        local_90 = local_90 + 1;
                                        printf(" %d",(ulong)uVar30);
                                        printf(" %d");
                                        putchar(10);
                                        in_RSI = pxVar16;
                                      }
                                      pxVar16 = (xmlDocPtr)(ulong)(iVar6 + 1);
                                    }
                                  }
                                  function_tests = function_tests + 1;
                                  local_94 = 0;
                                  for (uVar30 = 0; uVar30 != 2; uVar30 = uVar30 + 1) {
                                    pxVar16 = (xmlDocPtr)0x0;
                                    while( true ) {
                                      iVar33 = (int)in_RSI;
                                      iVar6 = (int)pxVar16;
                                      if (iVar6 == 4) break;
                                      iVar5 = xmlMemBlocks();
                                      if (uVar30 == 0) {
                                        lVar9 = xmlNewValidCtxt();
                                      }
                                      else {
                                        lVar9 = 0;
                                      }
                                      pxVar19 = gen_xmlDocPtr(iVar6,iVar33);
                                      in_RSI = pxVar19;
                                      xmlValidateDocument(lVar9);
                                      call_tests = call_tests + 1;
                                      iVar33 = extraout_EDX_08;
                                      if (lVar9 != 0) {
                                        xmlFreeValidCtxt(lVar9);
                                        iVar33 = extraout_EDX_09;
                                      }
                                      des_xmlDocPtr((int)pxVar19,in_RSI,iVar33);
                                      xmlResetLastError();
                                      iVar33 = xmlMemBlocks();
                                      if (iVar5 != iVar33) {
                                        iVar33 = xmlMemBlocks();
                                        printf("Leak of %d blocks found in xmlValidateDocument",
                                               (ulong)(uint)(iVar33 - iVar5));
                                        local_94 = local_94 + 1;
                                        printf(" %d",(ulong)uVar30);
                                        printf(" %d");
                                        putchar(10);
                                        in_RSI = pxVar16;
                                      }
                                      pxVar16 = (xmlDocPtr)(ulong)(iVar6 + 1);
                                    }
                                  }
                                  function_tests = function_tests + 1;
                                  local_98 = 0;
                                  uVar28 = 0;
                                  while (iVar33 = (int)uVar28, iVar33 != 2) {
                                    pxVar16 = (xmlDocPtr)0x0;
                                    while( true ) {
                                      iVar6 = (int)in_RSI;
                                      iVar5 = (int)pxVar16;
                                      if (iVar5 == 4) break;
                                      iVar3 = xmlMemBlocks();
                                      if (iVar33 == 0) {
                                        lVar9 = xmlNewValidCtxt();
                                      }
                                      else {
                                        lVar9 = 0;
                                      }
                                      pxVar19 = gen_xmlDocPtr(iVar5,iVar6);
                                      in_RSI = pxVar19;
                                      xmlValidateDocumentFinal(lVar9);
                                      call_tests = call_tests + 1;
                                      iVar6 = extraout_EDX_10;
                                      if (lVar9 != 0) {
                                        xmlFreeValidCtxt(lVar9);
                                        iVar6 = extraout_EDX_11;
                                      }
                                      des_xmlDocPtr((int)pxVar19,in_RSI,iVar6);
                                      xmlResetLastError();
                                      iVar6 = xmlMemBlocks();
                                      if (iVar3 != iVar6) {
                                        iVar6 = xmlMemBlocks();
                                        printf("Leak of %d blocks found in xmlValidateDocumentFinal"
                                               ,(ulong)(uint)(iVar6 - iVar3));
                                        local_98 = local_98 + 1;
                                        printf(" %d",uVar28);
                                        printf(" %d");
                                        putchar(10);
                                        in_RSI = pxVar16;
                                      }
                                      pxVar16 = (xmlDocPtr)(ulong)(iVar5 + 1);
                                    }
                                    uVar28 = (ulong)(iVar33 + 1);
                                  }
                                  function_tests = function_tests + 1;
                                  local_5c = 0;
                                  for (iVar33 = 0; iVar33 != 2; iVar33 = iVar33 + 1) {
                                    uVar28 = 0;
                                    while (iVar6 = (int)uVar28, iVar6 != 4) {
                                      pxVar16 = (xmlDocPtr)0x0;
                                      while( true ) {
                                        iVar5 = (int)in_RSI;
                                        iVar3 = (int)pxVar16;
                                        if (iVar3 == 3) break;
                                        iVar2 = xmlMemBlocks();
                                        if (iVar33 == 0) {
                                          lVar9 = xmlNewValidCtxt();
                                        }
                                        else {
                                          lVar9 = 0;
                                        }
                                        pxVar21 = gen_xmlDocPtr(iVar6,iVar5);
                                        in_RSI = (xmlDocPtr)gen_xmlDtdPtr(iVar3,iVar5);
                                        pxVar19 = pxVar21;
                                        xmlValidateDtd(lVar9,pxVar21,in_RSI);
                                        call_tests = call_tests + 1;
                                        iVar5 = extraout_EDX_12;
                                        if (lVar9 != 0) {
                                          xmlFreeValidCtxt(lVar9);
                                          iVar5 = extraout_EDX_13;
                                        }
                                        des_xmlDocPtr((int)pxVar21,pxVar19,iVar5);
                                        des_xmlDtdPtr(iVar3,(xmlDtdPtr)in_RSI,nr_17);
                                        xmlResetLastError();
                                        iVar5 = xmlMemBlocks();
                                        if (iVar2 != iVar5) {
                                          iVar5 = xmlMemBlocks();
                                          printf("Leak of %d blocks found in xmlValidateDtd",
                                                 (ulong)(uint)(iVar5 - iVar2));
                                          local_5c = local_5c + 1;
                                          printf(" %d",iVar33);
                                          printf(" %d",uVar28);
                                          printf(" %d");
                                          putchar(10);
                                          in_RSI = pxVar16;
                                        }
                                        pxVar16 = (xmlDocPtr)(ulong)(iVar3 + 1);
                                      }
                                      uVar28 = (ulong)(iVar6 + 1);
                                    }
                                  }
                                  function_tests = function_tests + 1;
                                  local_9c = 0;
                                  for (uVar30 = 0; uVar30 != 2; uVar30 = uVar30 + 1) {
                                    pxVar16 = (xmlDocPtr)0x0;
                                    while( true ) {
                                      iVar33 = (int)in_RSI;
                                      iVar6 = (int)pxVar16;
                                      if (iVar6 == 4) break;
                                      iVar5 = xmlMemBlocks();
                                      if (uVar30 == 0) {
                                        lVar9 = xmlNewValidCtxt();
                                      }
                                      else {
                                        lVar9 = 0;
                                      }
                                      pxVar19 = gen_xmlDocPtr(iVar6,iVar33);
                                      in_RSI = pxVar19;
                                      xmlValidateDtdFinal(lVar9);
                                      call_tests = call_tests + 1;
                                      iVar33 = extraout_EDX_14;
                                      if (lVar9 != 0) {
                                        xmlFreeValidCtxt(lVar9);
                                        iVar33 = extraout_EDX_15;
                                      }
                                      des_xmlDocPtr((int)pxVar19,in_RSI,iVar33);
                                      xmlResetLastError();
                                      iVar33 = xmlMemBlocks();
                                      if (iVar5 != iVar33) {
                                        iVar33 = xmlMemBlocks();
                                        printf("Leak of %d blocks found in xmlValidateDtdFinal",
                                               (ulong)(uint)(iVar33 - iVar5));
                                        local_9c = local_9c + 1;
                                        printf(" %d",(ulong)uVar30);
                                        printf(" %d");
                                        putchar(10);
                                        in_RSI = pxVar16;
                                      }
                                      pxVar16 = (xmlDocPtr)(ulong)(iVar6 + 1);
                                    }
                                  }
                                  function_tests = function_tests + 1;
                                  local_60 = 0;
                                  for (iVar33 = 0; iVar33 != 2; iVar33 = iVar33 + 1) {
                                    uVar28 = 0;
                                    while (iVar6 = (int)uVar28, iVar6 != 4) {
                                      pxVar16 = (xmlDocPtr)0x0;
                                      while( true ) {
                                        iVar5 = (int)in_RSI;
                                        iVar3 = (int)pxVar16;
                                        if (iVar3 == 3) break;
                                        iVar2 = xmlMemBlocks();
                                        if (iVar33 == 0) {
                                          lVar9 = xmlNewValidCtxt();
                                        }
                                        else {
                                          lVar9 = 0;
                                        }
                                        pxVar21 = gen_xmlDocPtr(iVar6,iVar5);
                                        in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar3,iVar5);
                                        pxVar19 = pxVar21;
                                        xmlValidateElement(lVar9,pxVar21,in_RSI);
                                        call_tests = call_tests + 1;
                                        iVar5 = extraout_EDX_16;
                                        if (lVar9 != 0) {
                                          xmlFreeValidCtxt(lVar9);
                                          iVar5 = extraout_EDX_17;
                                        }
                                        des_xmlDocPtr((int)pxVar21,pxVar19,iVar5);
                                        des_xmlNodePtr(iVar3,(xmlNodePtr)in_RSI,nr_18);
                                        xmlResetLastError();
                                        iVar5 = xmlMemBlocks();
                                        if (iVar2 != iVar5) {
                                          iVar5 = xmlMemBlocks();
                                          printf("Leak of %d blocks found in xmlValidateElement",
                                                 (ulong)(uint)(iVar5 - iVar2));
                                          local_60 = local_60 + 1;
                                          printf(" %d",iVar33);
                                          printf(" %d",uVar28);
                                          printf(" %d");
                                          putchar(10);
                                          in_RSI = pxVar16;
                                        }
                                        pxVar16 = (xmlDocPtr)(ulong)(iVar3 + 1);
                                      }
                                      uVar28 = (ulong)(iVar6 + 1);
                                    }
                                  }
                                  function_tests = function_tests + 1;
                                  uVar30 = 0;
                                  local_70 = 0;
                                  do {
                                    if (uVar30 == 2) {
                                      function_tests = function_tests + 1;
                                      local_bc = 0;
                                      for (uVar30 = 0; uVar30 != 5; uVar30 = uVar30 + 1) {
                                        iVar33 = xmlMemBlocks();
                                        pxVar10 = gen_const_xmlChar_ptr(uVar30,(int)in_RSI);
                                        xmlValidateNameValue(pxVar10);
                                        call_tests = call_tests + 1;
                                        xmlResetLastError();
                                        iVar6 = xmlMemBlocks();
                                        if (iVar33 != iVar6) {
                                          iVar6 = xmlMemBlocks();
                                          printf("Leak of %d blocks found in xmlValidateNameValue",
                                                 (ulong)(uint)(iVar6 - iVar33));
                                          local_bc = local_bc + 1;
                                          in_RSI = (xmlDocPtr)(ulong)uVar30;
                                          printf(" %d");
                                          putchar(10);
                                        }
                                      }
                                      function_tests = function_tests + 1;
                                      local_c0 = 0;
                                      for (uVar30 = 0; uVar30 != 5; uVar30 = uVar30 + 1) {
                                        iVar33 = xmlMemBlocks();
                                        pxVar10 = gen_const_xmlChar_ptr(uVar30,(int)in_RSI);
                                        xmlValidateNamesValue(pxVar10);
                                        call_tests = call_tests + 1;
                                        xmlResetLastError();
                                        iVar6 = xmlMemBlocks();
                                        if (iVar33 != iVar6) {
                                          iVar6 = xmlMemBlocks();
                                          printf("Leak of %d blocks found in xmlValidateNamesValue",
                                                 (ulong)(uint)(iVar6 - iVar33));
                                          local_c0 = local_c0 + 1;
                                          in_RSI = (xmlDocPtr)(ulong)uVar30;
                                          printf(" %d");
                                          putchar(10);
                                        }
                                      }
                                      function_tests = function_tests + 1;
                                      local_c4 = 0;
                                      for (uVar30 = 0; uVar30 != 5; uVar30 = uVar30 + 1) {
                                        iVar33 = xmlMemBlocks();
                                        pxVar10 = gen_const_xmlChar_ptr(uVar30,(int)in_RSI);
                                        xmlValidateNmtokenValue(pxVar10);
                                        call_tests = call_tests + 1;
                                        xmlResetLastError();
                                        iVar6 = xmlMemBlocks();
                                        if (iVar33 != iVar6) {
                                          iVar6 = xmlMemBlocks();
                                          printf("Leak of %d blocks found in xmlValidateNmtokenValue"
                                                 ,(ulong)(uint)(iVar6 - iVar33));
                                          local_c4 = local_c4 + 1;
                                          in_RSI = (xmlDocPtr)(ulong)uVar30;
                                          printf(" %d");
                                          putchar(10);
                                        }
                                      }
                                      function_tests = function_tests + 1;
                                      test_ret_7 = 0;
                                      for (uVar30 = 0; uVar30 != 5; uVar30 = uVar30 + 1) {
                                        iVar33 = xmlMemBlocks();
                                        pxVar10 = gen_const_xmlChar_ptr(uVar30,(int)in_RSI);
                                        xmlValidateNmtokensValue(pxVar10);
                                        call_tests = call_tests + 1;
                                        xmlResetLastError();
                                        iVar6 = xmlMemBlocks();
                                        if (iVar33 != iVar6) {
                                          iVar6 = xmlMemBlocks();
                                          printf("Leak of %d blocks found in xmlValidateNmtokensValue"
                                                 ,(ulong)(uint)(iVar6 - iVar33));
                                          test_ret_7 = test_ret_7 + 1;
                                          in_RSI = (xmlDocPtr)(ulong)uVar30;
                                          printf(" %d");
                                          putchar(10);
                                        }
                                      }
                                      function_tests = function_tests + 1;
                                      uVar28 = 0;
                                      local_74 = 0;
                                      do {
                                        iVar33 = (int)uVar28;
                                        if (iVar33 == 2) {
                                          function_tests = function_tests + 1;
                                          local_64 = 0;
                                          for (uVar30 = 0; uVar30 != 2; uVar30 = uVar30 + 1) {
                                            uVar28 = 0;
                                            while (iVar33 = (int)uVar28, iVar33 != 4) {
                                              pxVar16 = (xmlDocPtr)0x0;
                                              while( true ) {
                                                iVar6 = (int)in_RSI;
                                                iVar5 = (int)pxVar16;
                                                if (iVar5 == 5) break;
                                                iVar3 = xmlMemBlocks();
                                                if (uVar30 == 0) {
                                                  lVar9 = xmlNewValidCtxt();
                                                }
                                                else {
                                                  lVar9 = 0;
                                                }
                                                pxVar19 = gen_xmlDocPtr(iVar33,iVar6);
                                                pxVar10 = gen_const_xmlChar_ptr(iVar5,iVar6);
                                                in_RSI = pxVar19;
                                                xmlValidateNotationUse(lVar9,pxVar19,pxVar10);
                                                call_tests = call_tests + 1;
                                                iVar6 = extraout_EDX_22;
                                                if (lVar9 != 0) {
                                                  xmlFreeValidCtxt(lVar9);
                                                  iVar6 = extraout_EDX_23;
                                                }
                                                des_xmlDocPtr((int)pxVar19,in_RSI,iVar6);
                                                xmlResetLastError();
                                                iVar6 = xmlMemBlocks();
                                                if (iVar3 != iVar6) {
                                                  iVar6 = xmlMemBlocks();
                                                  printf(
                                                  "Leak of %d blocks found in xmlValidateNotationUse"
                                                  ,(ulong)(uint)(iVar6 - iVar3));
                                                  local_64 = local_64 + 1;
                                                  printf(" %d",(ulong)uVar30);
                                                  printf(" %d",uVar28);
                                                  printf(" %d");
                                                  putchar(10);
                                                  in_RSI = pxVar16;
                                                }
                                                pxVar16 = (xmlDocPtr)(ulong)(iVar5 + 1);
                                              }
                                              uVar28 = (ulong)(iVar33 + 1);
                                            }
                                          }
                                          function_tests = function_tests + 1;
                                          local_ec = 0;
                                          for (iVar33 = 0; iVar33 != 2; iVar33 = iVar33 + 1) {
                                            for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
                                              uVar28 = 0;
                                              while (iVar5 = (int)uVar28, iVar5 != 3) {
                                                for (iVar3 = 0; iVar3 != 2; iVar3 = iVar3 + 1) {
                                                  pxVar16 = (xmlDocPtr)0x0;
                                                  while( true ) {
                                                    iVar1 = (int)in_RSI;
                                                    iVar2 = (int)pxVar16;
                                                    if (iVar2 == 5) break;
                                                    iVar7 = xmlMemBlocks();
                                                    if (iVar33 == 0) {
                                                      lVar9 = xmlNewValidCtxt();
                                                    }
                                                    else {
                                                      lVar9 = 0;
                                                    }
                                                    pxVar21 = gen_xmlDocPtr(iVar6,iVar1);
                                                    in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar5,iVar1);
                                                    pxVar20 = gen_xmlAttrPtr(iVar3,iVar1);
                                                    pxVar10 = gen_const_xmlChar_ptr(iVar2,iVar1);
                                                    pxVar19 = pxVar21;
                                                    xmlValidateOneAttribute
                                                              (lVar9,pxVar21,in_RSI,pxVar20,pxVar10)
                                                    ;
                                                    call_tests = call_tests + 1;
                                                    iVar1 = extraout_EDX_24;
                                                    if (lVar9 != 0) {
                                                      xmlFreeValidCtxt(lVar9);
                                                      iVar1 = extraout_EDX_25;
                                                    }
                                                    des_xmlDocPtr((int)pxVar21,pxVar19,iVar1);
                                                    des_xmlNodePtr(iVar5,(xmlNodePtr)in_RSI,nr_19);
                                                    if (iVar3 == 0) {
                                                      free_api_doc();
                                                    }
                                                    xmlResetLastError();
                                                    iVar1 = xmlMemBlocks();
                                                    if (iVar7 != iVar1) {
                                                      iVar1 = xmlMemBlocks();
                                                      printf(
                                                  "Leak of %d blocks found in xmlValidateOneAttribute"
                                                  ,(ulong)(uint)(iVar1 - iVar7));
                                                  local_ec = local_ec + 1;
                                                  printf(" %d",iVar33);
                                                  printf(" %d",iVar6);
                                                  printf(" %d",uVar28);
                                                  printf(" %d",iVar3);
                                                  printf(" %d");
                                                  putchar(10);
                                                  in_RSI = pxVar16;
                                                  }
                                                  pxVar16 = (xmlDocPtr)(ulong)(iVar2 + 1);
                                                  }
                                                }
                                                uVar28 = (ulong)(iVar5 + 1);
                                              }
                                            }
                                          }
                                          function_tests = function_tests + 1;
                                          local_68 = 0;
                                          for (iVar33 = 0; iVar33 != 2; iVar33 = iVar33 + 1) {
                                            uVar28 = 0;
                                            while (iVar6 = (int)uVar28, iVar6 != 4) {
                                              pxVar16 = (xmlDocPtr)0x0;
                                              while( true ) {
                                                iVar5 = (int)in_RSI;
                                                iVar3 = (int)pxVar16;
                                                if (iVar3 == 3) break;
                                                iVar2 = xmlMemBlocks();
                                                if (iVar33 == 0) {
                                                  lVar9 = xmlNewValidCtxt();
                                                }
                                                else {
                                                  lVar9 = 0;
                                                }
                                                pxVar21 = gen_xmlDocPtr(iVar6,iVar5);
                                                in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar3,iVar5);
                                                pxVar19 = pxVar21;
                                                xmlValidateOneElement(lVar9,pxVar21,in_RSI);
                                                call_tests = call_tests + 1;
                                                iVar5 = extraout_EDX_26;
                                                if (lVar9 != 0) {
                                                  xmlFreeValidCtxt(lVar9);
                                                  iVar5 = extraout_EDX_27;
                                                }
                                                des_xmlDocPtr((int)pxVar21,pxVar19,iVar5);
                                                des_xmlNodePtr(iVar3,(xmlNodePtr)in_RSI,nr_20);
                                                xmlResetLastError();
                                                iVar5 = xmlMemBlocks();
                                                if (iVar2 != iVar5) {
                                                  iVar5 = xmlMemBlocks();
                                                  printf(
                                                  "Leak of %d blocks found in xmlValidateOneElement"
                                                  ,(ulong)(uint)(iVar5 - iVar2));
                                                  local_68 = local_68 + 1;
                                                  printf(" %d",iVar33);
                                                  printf(" %d",uVar28);
                                                  printf(" %d");
                                                  putchar(10);
                                                  in_RSI = pxVar16;
                                                }
                                                pxVar16 = (xmlDocPtr)(ulong)(iVar3 + 1);
                                              }
                                              uVar28 = (ulong)(iVar6 + 1);
                                            }
                                          }
                                          function_tests = function_tests + 1;
                                          iVar33 = 0;
                                          for (iVar6 = 0; iVar6 != 2; iVar6 = iVar6 + 1) {
                                            for (iVar5 = 0; iVar5 != 4; iVar5 = iVar5 + 1) {
                                              for (iVar3 = 0; iVar3 != 3; iVar3 = iVar3 + 1) {
                                                for (uVar30 = 0; uVar30 != 5; uVar30 = uVar30 + 1) {
                                                  for (iVar2 = 0; iVar2 != 2; iVar2 = iVar2 + 1) {
                                                    pxVar16 = (xmlDocPtr)0x0;
                                                    while( true ) {
                                                      iVar1 = (int)in_RSI;
                                                      iVar7 = (int)pxVar16;
                                                      if (iVar7 == 5) break;
                                                      iVar8 = xmlMemBlocks();
                                                      if (iVar6 == 0) {
                                                        lVar9 = xmlNewValidCtxt();
                                                      }
                                                      else {
                                                        lVar9 = 0;
                                                      }
                                                      pxVar21 = gen_xmlDocPtr(iVar5,iVar1);
                                                      in_RSI = (xmlDocPtr)
                                                               gen_xmlNodePtr(iVar3,iVar1);
                                                      pxVar10 = gen_const_xmlChar_ptr(uVar30,iVar1);
                                                      pxVar22 = gen_xmlNsPtr(iVar2,iVar1);
                                                      pxVar11 = gen_const_xmlChar_ptr(iVar7,iVar1);
                                                      pxVar19 = pxVar21;
                                                      xmlValidateOneNamespace
                                                                (lVar9,pxVar21,in_RSI,pxVar10,
                                                                 pxVar22,pxVar11);
                                                      call_tests = call_tests + 1;
                                                      iVar1 = extraout_EDX_28;
                                                      if (lVar9 != 0) {
                                                        xmlFreeValidCtxt(lVar9);
                                                        iVar1 = extraout_EDX_29;
                                                      }
                                                      des_xmlDocPtr((int)pxVar21,pxVar19,iVar1);
                                                      des_xmlNodePtr(iVar3,(xmlNodePtr)in_RSI,nr_21)
                                                      ;
                                                      if (iVar2 == 0) {
                                                        free_api_doc();
                                                      }
                                                      xmlResetLastError();
                                                      iVar1 = xmlMemBlocks();
                                                      if (iVar8 != iVar1) {
                                                        iVar1 = xmlMemBlocks();
                                                        printf(
                                                  "Leak of %d blocks found in xmlValidateOneNamespace"
                                                  ,(ulong)(uint)(iVar1 - iVar8));
                                                  iVar33 = iVar33 + 1;
                                                  printf(" %d",iVar6);
                                                  printf(" %d",iVar5);
                                                  printf(" %d",iVar3);
                                                  printf(" %d",(ulong)uVar30);
                                                  printf(" %d",iVar2);
                                                  printf(" %d");
                                                  putchar(10);
                                                  in_RSI = pxVar16;
                                                  }
                                                  pxVar16 = (xmlDocPtr)(ulong)(iVar7 + 1);
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                          function_tests = function_tests + 1;
                                          local_104 = 0;
                                          for (uVar30 = 0; uVar30 != 2; uVar30 = uVar30 + 1) {
                                            for (uVar4 = 0; uVar4 != 4; uVar4 = uVar4 + 1) {
                                              for (iVar6 = 0; iVar6 != 3; iVar6 = iVar6 + 1) {
                                                pxVar16 = (xmlDocPtr)0x0;
                                                while( true ) {
                                                  iVar3 = (int)in_RSI;
                                                  iVar5 = (int)pxVar16;
                                                  if (iVar5 == 5) break;
                                                  iVar2 = xmlMemBlocks();
                                                  if (uVar30 == 0) {
                                                    lVar9 = xmlNewValidCtxt();
                                                  }
                                                  else {
                                                    lVar9 = 0;
                                                  }
                                                  pxVar21 = gen_xmlDocPtr(uVar4,iVar3);
                                                  in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar6,iVar3);
                                                  pxVar10 = gen_const_xmlChar_ptr(iVar5,iVar3);
                                                  pxVar19 = pxVar21;
                                                  xmlValidatePopElement
                                                            (lVar9,pxVar21,in_RSI,pxVar10);
                                                  call_tests = call_tests + 1;
                                                  iVar3 = extraout_EDX_30;
                                                  if (lVar9 != 0) {
                                                    xmlFreeValidCtxt(lVar9);
                                                    iVar3 = extraout_EDX_31;
                                                  }
                                                  des_xmlDocPtr((int)pxVar21,pxVar19,iVar3);
                                                  des_xmlNodePtr(iVar6,(xmlNodePtr)in_RSI,nr_22);
                                                  xmlResetLastError();
                                                  iVar3 = xmlMemBlocks();
                                                  if (iVar2 != iVar3) {
                                                    iVar3 = xmlMemBlocks();
                                                    printf(
                                                  "Leak of %d blocks found in xmlValidatePopElement"
                                                  ,(ulong)(uint)(iVar3 - iVar2));
                                                  local_104 = local_104 + 1;
                                                  printf(" %d",(ulong)uVar30);
                                                  printf(" %d",(ulong)uVar4);
                                                  printf(" %d",iVar6);
                                                  printf(" %d");
                                                  putchar(10);
                                                  in_RSI = pxVar16;
                                                  }
                                                  pxVar16 = (xmlDocPtr)(ulong)(iVar5 + 1);
                                                }
                                              }
                                            }
                                          }
                                          function_tests = function_tests + 1;
                                          iVar6 = 0;
                                          for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
                                            uVar28 = 0;
                                            while (iVar3 = (int)uVar28, iVar3 != 5) {
                                              pxVar16 = (xmlDocPtr)0x0;
                                              while (iVar2 = (int)pxVar16, iVar2 != 4) {
                                                iVar1 = xmlMemBlocks();
                                                if (iVar5 == 0) {
                                                  lVar9 = xmlNewValidCtxt();
                                                }
                                                else {
                                                  lVar9 = 0;
                                                }
                                                pxVar19 = (xmlDocPtr)
                                                          gen_const_xmlChar_ptr(iVar3,(int)in_RSI);
                                                iVar7 = gen_int(iVar2,(int)in_RSI);
                                                if ((pxVar19 == (xmlDocPtr)0x0) ||
                                                   (sVar23 = strlen((char *)pxVar19),
                                                   iVar7 <= (int)sVar23 + 1)) {
                                                  xmlValidatePushCData(lVar9,pxVar19,iVar7);
                                                  call_tests = call_tests + 1;
                                                  in_RSI = pxVar19;
                                                  if (lVar9 != 0) {
                                                    xmlFreeValidCtxt(lVar9);
                                                    in_RSI = pxVar19;
                                                  }
                                                  xmlResetLastError();
                                                  iVar7 = xmlMemBlocks();
                                                  if (iVar1 != iVar7) {
                                                    iVar7 = xmlMemBlocks();
                                                    printf(
                                                  "Leak of %d blocks found in xmlValidatePushCData",
                                                  (ulong)(uint)(iVar7 - iVar1));
                                                  iVar6 = iVar6 + 1;
                                                  printf(" %d",iVar5);
                                                  printf(" %d",uVar28);
                                                  printf(" %d");
                                                  putchar(10);
                                                  in_RSI = pxVar16;
                                                  }
                                                }
                                                pxVar16 = (xmlDocPtr)(ulong)(iVar2 + 1);
                                              }
                                              uVar28 = (ulong)(iVar3 + 1);
                                            }
                                          }
                                          function_tests = function_tests + 1;
                                          iVar5 = 0;
                                          for (uVar30 = 0; uVar30 != 2; uVar30 = uVar30 + 1) {
                                            for (uVar4 = 0; uVar4 != 4; uVar4 = uVar4 + 1) {
                                              for (iVar3 = 0; iVar3 != 3; iVar3 = iVar3 + 1) {
                                                pxVar16 = (xmlDocPtr)0x0;
                                                while( true ) {
                                                  iVar1 = (int)in_RSI;
                                                  iVar2 = (int)pxVar16;
                                                  if (iVar2 == 5) break;
                                                  iVar7 = xmlMemBlocks();
                                                  if (uVar30 == 0) {
                                                    lVar9 = xmlNewValidCtxt();
                                                  }
                                                  else {
                                                    lVar9 = 0;
                                                  }
                                                  pxVar21 = gen_xmlDocPtr(uVar4,iVar1);
                                                  in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar3,iVar1);
                                                  pxVar10 = gen_const_xmlChar_ptr(iVar2,iVar1);
                                                  pxVar19 = pxVar21;
                                                  xmlValidatePushElement
                                                            (lVar9,pxVar21,in_RSI,pxVar10);
                                                  call_tests = call_tests + 1;
                                                  iVar1 = extraout_EDX_32;
                                                  if (lVar9 != 0) {
                                                    xmlFreeValidCtxt(lVar9);
                                                    iVar1 = extraout_EDX_33;
                                                  }
                                                  des_xmlDocPtr((int)pxVar21,pxVar19,iVar1);
                                                  des_xmlNodePtr(iVar3,(xmlNodePtr)in_RSI,nr_23);
                                                  xmlResetLastError();
                                                  iVar1 = xmlMemBlocks();
                                                  if (iVar7 != iVar1) {
                                                    iVar1 = xmlMemBlocks();
                                                    printf(
                                                  "Leak of %d blocks found in xmlValidatePushElement"
                                                  ,(ulong)(uint)(iVar1 - iVar7));
                                                  iVar5 = iVar5 + 1;
                                                  printf(" %d",(ulong)uVar30);
                                                  printf(" %d",(ulong)uVar4);
                                                  printf(" %d",iVar3);
                                                  printf(" %d");
                                                  putchar(10);
                                                  in_RSI = pxVar16;
                                                  }
                                                  pxVar16 = (xmlDocPtr)(ulong)(iVar2 + 1);
                                                }
                                              }
                                            }
                                          }
                                          function_tests = function_tests + 1;
                                          iVar3 = 0;
                                          for (uVar30 = 0; uVar30 != 2; uVar30 = uVar30 + 1) {
                                            pxVar16 = (xmlDocPtr)0x0;
                                            while( true ) {
                                              iVar2 = (int)in_RSI;
                                              iVar1 = (int)pxVar16;
                                              if (iVar1 == 4) break;
                                              iVar7 = xmlMemBlocks();
                                              if (uVar30 == 0) {
                                                lVar9 = xmlNewValidCtxt();
                                              }
                                              else {
                                                lVar9 = 0;
                                              }
                                              pxVar19 = gen_xmlDocPtr(iVar1,iVar2);
                                              in_RSI = pxVar19;
                                              xmlValidateRoot(lVar9);
                                              call_tests = call_tests + 1;
                                              iVar2 = extraout_EDX_34;
                                              if (lVar9 != 0) {
                                                xmlFreeValidCtxt(lVar9);
                                                iVar2 = extraout_EDX_35;
                                              }
                                              des_xmlDocPtr((int)pxVar19,in_RSI,iVar2);
                                              xmlResetLastError();
                                              iVar2 = xmlMemBlocks();
                                              if (iVar7 != iVar2) {
                                                iVar2 = xmlMemBlocks();
                                                printf("Leak of %d blocks found in xmlValidateRoot",
                                                       (ulong)(uint)(iVar2 - iVar7));
                                                iVar3 = iVar3 + 1;
                                                printf(" %d",(ulong)uVar30);
                                                printf(" %d");
                                                putchar(10);
                                                in_RSI = pxVar16;
                                              }
                                              pxVar16 = (xmlDocPtr)(ulong)(iVar1 + 1);
                                            }
                                          }
                                          function_tests = function_tests + 1;
                                          iVar27 = local_74 + local_64 + local_ec + local_68 +
                                                   iVar33 + local_104 + iVar6 + iVar5 + iVar3 +
                                                   local_5c + local_9c + local_60 + local_70 +
                                                   local_bc + local_c0 + local_c4 + test_ret_7 +
                                                   test_ret_6 + local_3c + local_40 + local_6c +
                                                   local_90 + local_94 + local_98 +
                                                   local_88 + local_8c + local_f0 + local_58 +
                                                   test_ret_5 + iVar31 +
                                                   local_4c + test_ret_4 + local_50 + local_54 +
                                                   local_84 +
                                                   test_ret_2 + iVar27 + local_48 + test_ret_3 +
                                                   local_b0 + test_ret_1 + local_44 +
                                                   local_a8 + local_ac + local_a0 + local_a4;
                                          uVar30 = -(local_f8 - iVar27);
                                          if (local_f8 != iVar27) {
                                            printf("Module valid: %d errors\n",(ulong)uVar30);
                                          }
                                          return uVar30;
                                        }
                                        for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
                                          bVar26 = true;
                                          while (iVar5 = (int)in_RSI, bVar26) {
                                            iVar3 = xmlMemBlocks();
                                            if (iVar33 == 0) {
                                              lVar9 = xmlNewValidCtxt();
                                            }
                                            else {
                                              lVar9 = 0;
                                            }
                                            pxVar16 = gen_xmlDocPtr(iVar6,iVar5);
                                            in_RSI = pxVar16;
                                            xmlValidateNotationDecl(lVar9,pxVar16,0);
                                            call_tests = call_tests + 1;
                                            iVar5 = extraout_EDX_20;
                                            if (lVar9 != 0) {
                                              xmlFreeValidCtxt(lVar9);
                                              iVar5 = extraout_EDX_21;
                                            }
                                            des_xmlDocPtr((int)pxVar16,in_RSI,iVar5);
                                            xmlResetLastError();
                                            iVar5 = xmlMemBlocks();
                                            if (iVar3 == iVar5) break;
                                            iVar5 = xmlMemBlocks();
                                            bVar26 = false;
                                            printf(
                                                  "Leak of %d blocks found in xmlValidateNotationDecl"
                                                  ,(ulong)(uint)(iVar5 - iVar3));
                                            local_74 = local_74 + 1;
                                            printf(" %d",uVar28);
                                            printf(" %d");
                                            in_RSI = (xmlDocPtr)0x0;
                                            printf(" %d");
                                            putchar(10);
                                          }
                                        }
                                        uVar28 = (ulong)(iVar33 + 1);
                                      } while( true );
                                    }
                                    for (iVar33 = 0; iVar33 != 4; iVar33 = iVar33 + 1) {
                                      bVar26 = true;
                                      while (iVar6 = (int)in_RSI, bVar26) {
                                        iVar5 = xmlMemBlocks();
                                        if (uVar30 == 0) {
                                          lVar9 = xmlNewValidCtxt();
                                        }
                                        else {
                                          lVar9 = 0;
                                        }
                                        pxVar16 = gen_xmlDocPtr(iVar33,iVar6);
                                        in_RSI = pxVar16;
                                        xmlValidateElementDecl(lVar9,pxVar16,0);
                                        call_tests = call_tests + 1;
                                        iVar6 = extraout_EDX_18;
                                        if (lVar9 != 0) {
                                          xmlFreeValidCtxt(lVar9);
                                          iVar6 = extraout_EDX_19;
                                        }
                                        des_xmlDocPtr((int)pxVar16,in_RSI,iVar6);
                                        xmlResetLastError();
                                        iVar6 = xmlMemBlocks();
                                        if (iVar5 == iVar6) break;
                                        iVar6 = xmlMemBlocks();
                                        bVar26 = false;
                                        printf("Leak of %d blocks found in xmlValidateElementDecl",
                                               (ulong)(uint)(iVar6 - iVar5));
                                        local_70 = local_70 + 1;
                                        printf(" %d",(ulong)uVar30);
                                        printf(" %d");
                                        in_RSI = (xmlDocPtr)0x0;
                                        printf(" %d");
                                        putchar(10);
                                      }
                                    }
                                    uVar30 = uVar30 + 1;
                                  } while( true );
                                }
                                for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
                                  bVar26 = true;
                                  while (iVar5 = (int)in_RSI, bVar26) {
                                    iVar3 = xmlMemBlocks();
                                    if (iVar33 == 0) {
                                      lVar9 = xmlNewValidCtxt();
                                    }
                                    else {
                                      lVar9 = 0;
                                    }
                                    pxVar16 = gen_xmlDocPtr(iVar6,iVar5);
                                    in_RSI = pxVar16;
                                    xmlValidateAttributeDecl(lVar9,pxVar16,0);
                                    call_tests = call_tests + 1;
                                    iVar5 = extraout_EDX_06;
                                    if (lVar9 != 0) {
                                      xmlFreeValidCtxt(lVar9);
                                      iVar5 = extraout_EDX_07;
                                    }
                                    des_xmlDocPtr((int)pxVar16,in_RSI,iVar5);
                                    xmlResetLastError();
                                    iVar5 = xmlMemBlocks();
                                    if (iVar3 == iVar5) break;
                                    iVar5 = xmlMemBlocks();
                                    bVar26 = false;
                                    printf("Leak of %d blocks found in xmlValidateAttributeDecl",
                                           (ulong)(uint)(iVar5 - iVar3));
                                    local_6c = local_6c + 1;
                                    printf(" %d",uVar28);
                                    printf(" %d");
                                    in_RSI = (xmlDocPtr)0x0;
                                    printf(" %d");
                                    putchar(10);
                                  }
                                }
                                uVar28 = (ulong)(iVar33 + 1);
                              } while( true );
                            }
                            bVar26 = true;
                            while (bVar26) {
                              iVar33 = xmlMemBlocks();
                              if (iVar31 == 0) {
                                lVar9 = xmlNewValidCtxt();
                              }
                              else {
                                lVar9 = 0;
                              }
                              in_RSI = (xmlDocPtr)0x0;
                              xmlValidBuildContentModel(lVar9);
                              call_tests = call_tests + 1;
                              if (lVar9 != 0) {
                                xmlFreeValidCtxt(lVar9);
                              }
                              xmlResetLastError();
                              iVar6 = xmlMemBlocks();
                              if (iVar33 == iVar6) break;
                              iVar6 = xmlMemBlocks();
                              bVar26 = false;
                              printf("Leak of %d blocks found in xmlValidBuildContentModel",
                                     (ulong)(uint)(iVar6 - iVar33));
                              test_ret_5 = test_ret_5 + 1;
                              printf(" %d");
                              in_RSI = (xmlDocPtr)0x0;
                              printf(" %d");
                              putchar(10);
                            }
                            iVar31 = iVar31 + 1;
                          } while( true );
                        }
                        bVar26 = true;
                        while (iVar31 = (int)in_RSI, bVar26) {
                          iVar33 = xmlMemBlocks();
                          pxVar18 = gen_xmlBufferPtr(iVar27,iVar31);
                          in_RSI = (xmlDocPtr)0x0;
                          xmlDumpNotationTable(pxVar18);
                          call_tests = call_tests + 1;
                          if (pxVar18 != (xmlBufferPtr)0x0) {
                            xmlBufferFree(pxVar18);
                          }
                          xmlResetLastError();
                          iVar31 = xmlMemBlocks();
                          if (iVar33 == iVar31) break;
                          iVar31 = xmlMemBlocks();
                          bVar26 = false;
                          printf("Leak of %d blocks found in xmlDumpNotationTable",
                                 (ulong)(uint)(iVar31 - iVar33));
                          test_ret_1 = test_ret_1 + 1;
                          printf(" %d");
                          in_RSI = (xmlDocPtr)0x0;
                          printf(" %d");
                          putchar(10);
                        }
                        iVar27 = iVar27 + 1;
                      } while( true );
                    }
                    bVar26 = true;
                    while (iVar31 = (int)in_RSI, bVar26) {
                      iVar33 = xmlMemBlocks();
                      pxVar18 = gen_xmlBufferPtr(iVar27,iVar31);
                      in_RSI = (xmlDocPtr)0x0;
                      xmlDumpNotationDecl(pxVar18);
                      call_tests = call_tests + 1;
                      if (pxVar18 != (xmlBufferPtr)0x0) {
                        xmlBufferFree(pxVar18);
                      }
                      xmlResetLastError();
                      iVar31 = xmlMemBlocks();
                      if (iVar33 == iVar31) break;
                      iVar31 = xmlMemBlocks();
                      bVar26 = false;
                      printf("Leak of %d blocks found in xmlDumpNotationDecl",
                             (ulong)(uint)(iVar31 - iVar33));
                      local_b0 = local_b0 + 1;
                      printf(" %d");
                      in_RSI = (xmlDocPtr)0x0;
                      printf(" %d");
                      putchar(10);
                    }
                    iVar27 = iVar27 + 1;
                  } while( true );
                }
                bVar26 = true;
                while (iVar31 = (int)in_RSI, bVar26) {
                  iVar33 = xmlMemBlocks();
                  pxVar18 = gen_xmlBufferPtr(iVar27,iVar31);
                  in_RSI = (xmlDocPtr)0x0;
                  xmlDumpElementTable(pxVar18);
                  call_tests = call_tests + 1;
                  if (pxVar18 != (xmlBufferPtr)0x0) {
                    xmlBufferFree(pxVar18);
                  }
                  xmlResetLastError();
                  iVar31 = xmlMemBlocks();
                  if (iVar33 == iVar31) break;
                  iVar31 = xmlMemBlocks();
                  bVar26 = false;
                  printf("Leak of %d blocks found in xmlDumpElementTable",
                         (ulong)(uint)(iVar31 - iVar33));
                  local_ac = local_ac + 1;
                  printf(" %d");
                  in_RSI = (xmlDocPtr)0x0;
                  printf(" %d");
                  putchar(10);
                }
                iVar27 = iVar27 + 1;
              } while( true );
            }
            bVar26 = true;
            while (iVar31 = (int)in_RSI, bVar26) {
              iVar33 = xmlMemBlocks();
              pxVar18 = gen_xmlBufferPtr(iVar27,iVar31);
              in_RSI = (xmlDocPtr)0x0;
              xmlDumpElementDecl(pxVar18);
              call_tests = call_tests + 1;
              if (pxVar18 != (xmlBufferPtr)0x0) {
                xmlBufferFree(pxVar18);
              }
              xmlResetLastError();
              iVar31 = xmlMemBlocks();
              if (iVar33 == iVar31) break;
              iVar31 = xmlMemBlocks();
              bVar26 = false;
              printf("Leak of %d blocks found in xmlDumpElementDecl",(ulong)(uint)(iVar31 - iVar33))
              ;
              local_a8 = local_a8 + 1;
              printf(" %d");
              in_RSI = (xmlDocPtr)0x0;
              printf(" %d");
              putchar(10);
            }
            iVar27 = iVar27 + 1;
          } while( true );
        }
        bVar26 = true;
        while (iVar31 = (int)in_RSI, bVar26) {
          iVar33 = xmlMemBlocks();
          pxVar18 = gen_xmlBufferPtr(iVar27,iVar31);
          in_RSI = (xmlDocPtr)0x0;
          xmlDumpAttributeTable(pxVar18);
          call_tests = call_tests + 1;
          if (pxVar18 != (xmlBufferPtr)0x0) {
            xmlBufferFree(pxVar18);
          }
          xmlResetLastError();
          iVar31 = xmlMemBlocks();
          if (iVar33 == iVar31) break;
          iVar31 = xmlMemBlocks();
          bVar26 = false;
          printf("Leak of %d blocks found in xmlDumpAttributeTable",(ulong)(uint)(iVar31 - iVar33));
          local_a4 = local_a4 + 1;
          printf(" %d");
          in_RSI = (xmlDocPtr)0x0;
          printf(" %d");
          putchar(10);
        }
        iVar27 = iVar27 + 1;
      } while( true );
    }
    bVar26 = true;
    while (iVar31 = (int)in_RSI, bVar26) {
      iVar33 = xmlMemBlocks();
      pxVar18 = gen_xmlBufferPtr(iVar27,iVar31);
      in_RSI = (xmlDocPtr)0x0;
      xmlDumpAttributeDecl(pxVar18);
      call_tests = call_tests + 1;
      if (pxVar18 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar18);
      }
      xmlResetLastError();
      iVar31 = xmlMemBlocks();
      if (iVar33 == iVar31) break;
      iVar31 = xmlMemBlocks();
      bVar26 = false;
      printf("Leak of %d blocks found in xmlDumpAttributeDecl",(ulong)(uint)(iVar31 - iVar33));
      local_a0 = local_a0 + 1;
      printf(" %d");
      in_RSI = (xmlDocPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar27 = iVar27 + 1;
  } while( true );
}

Assistant:

static int
test_valid(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing valid : 50 of 70 functions ...\n");
    test_ret += test_xmlAddAttributeDecl();
    test_ret += test_xmlAddElementDecl();
    test_ret += test_xmlAddID();
    test_ret += test_xmlAddNotationDecl();
    test_ret += test_xmlAddRef();
    test_ret += test_xmlCopyAttributeTable();
    test_ret += test_xmlCopyDocElementContent();
    test_ret += test_xmlCopyElementContent();
    test_ret += test_xmlCopyElementTable();
    test_ret += test_xmlCopyEnumeration();
    test_ret += test_xmlCopyNotationTable();
    test_ret += test_xmlCreateEnumeration();
    test_ret += test_xmlDumpAttributeDecl();
    test_ret += test_xmlDumpAttributeTable();
    test_ret += test_xmlDumpElementDecl();
    test_ret += test_xmlDumpElementTable();
    test_ret += test_xmlDumpNotationDecl();
    test_ret += test_xmlDumpNotationTable();
    test_ret += test_xmlGetDtdAttrDesc();
    test_ret += test_xmlGetDtdElementDesc();
    test_ret += test_xmlGetDtdNotationDesc();
    test_ret += test_xmlGetDtdQAttrDesc();
    test_ret += test_xmlGetDtdQElementDesc();
    test_ret += test_xmlGetID();
    test_ret += test_xmlGetRefs();
    test_ret += test_xmlIsID();
    test_ret += test_xmlIsMixedElement();
    test_ret += test_xmlIsRef();
    test_ret += test_xmlNewDocElementContent();
    test_ret += test_xmlNewElementContent();
    test_ret += test_xmlNewValidCtxt();
    test_ret += test_xmlRemoveID();
    test_ret += test_xmlRemoveRef();
    test_ret += test_xmlSnprintfElementContent();
    test_ret += test_xmlSprintfElementContent();
    test_ret += test_xmlValidBuildContentModel();
    test_ret += test_xmlValidCtxtNormalizeAttributeValue();
    test_ret += test_xmlValidGetPotentialChildren();
    test_ret += test_xmlValidGetValidElements();
    test_ret += test_xmlValidNormalizeAttributeValue();
    test_ret += test_xmlValidateAttributeDecl();
    test_ret += test_xmlValidateAttributeValue();
    test_ret += test_xmlValidateDocument();
    test_ret += test_xmlValidateDocumentFinal();
    test_ret += test_xmlValidateDtd();
    test_ret += test_xmlValidateDtdFinal();
    test_ret += test_xmlValidateElement();
    test_ret += test_xmlValidateElementDecl();
    test_ret += test_xmlValidateNameValue();
    test_ret += test_xmlValidateNamesValue();
    test_ret += test_xmlValidateNmtokenValue();
    test_ret += test_xmlValidateNmtokensValue();
    test_ret += test_xmlValidateNotationDecl();
    test_ret += test_xmlValidateNotationUse();
    test_ret += test_xmlValidateOneAttribute();
    test_ret += test_xmlValidateOneElement();
    test_ret += test_xmlValidateOneNamespace();
    test_ret += test_xmlValidatePopElement();
    test_ret += test_xmlValidatePushCData();
    test_ret += test_xmlValidatePushElement();
    test_ret += test_xmlValidateRoot();

    if (test_ret != 0)
	printf("Module valid: %d errors\n", test_ret);
    return(test_ret);
}